

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O2

base_learner * marginal_setup(options_i *options,vw *all)

{
  int iVar1;
  typed_option<float> *ptVar2;
  long lVar3;
  base_learner *l;
  single_learner *base;
  learner<MARGINAL::data,_example> *plVar4;
  size_t u;
  long lVar5;
  free_ptr<MARGINAL::data> d;
  option_group_definition marginal_options;
  string marginal;
  allocator local_6b2;
  allocator local_6b1;
  string local_6b0 [32];
  free_ptr<MARGINAL::data> local_690;
  undefined1 local_680 [112];
  bool local_610;
  option_group_definition local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  typed_option<float> local_488;
  typed_option<bool> local_3e8;
  typed_option<bool> local_348;
  typed_option<bool> local_2a8;
  typed_option<float> local_208;
  typed_option<float> local_168;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  
  scoped_calloc_or_throw<MARGINAL::data>();
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  local_5a8._M_string_length = 0;
  local_5a8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_4a8,"VW options",(allocator *)local_680);
  VW::config::option_group_definition::option_group_definition(&local_5e0,&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::string((string *)&local_4c8,"marginal",&local_6b1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_680,&local_4c8,&local_5a8);
  local_610 = true;
  std::__cxx11::string::string(local_6b0,"substitute marginal label estimates for ids",&local_6b2);
  std::__cxx11::string::_M_assign((string *)(local_680 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_c8,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_680);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_5e0,&local_c8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_c8);
  std::__cxx11::string::~string(local_6b0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_680);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string((string *)&local_4e8,"initial_denominator",&local_6b1);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_680,&local_4e8,
             &(local_690._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->initial_denominator);
  ptVar2 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_680,1.0);
  std::__cxx11::string::string(local_6b0,"initial denominator",&local_6b2);
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_168,ptVar2);
  VW::config::option_group_definition::add<float>(&local_5e0,&local_168);
  VW::config::typed_option<float>::~typed_option(&local_168);
  std::__cxx11::string::~string(local_6b0);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_680);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_508,"initial_numerator",&local_6b1);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_680,&local_508,
             &(local_690._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->initial_numerator);
  ptVar2 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_680,0.5);
  std::__cxx11::string::string(local_6b0,"initial numerator",&local_6b2);
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_208,ptVar2);
  VW::config::option_group_definition::add<float>(&local_5e0,&local_208);
  VW::config::typed_option<float>::~typed_option(&local_208);
  std::__cxx11::string::~string(local_6b0);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_680);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::string((string *)&local_528,"compete",&local_6b1);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_680,&local_528,
             &(local_690._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->compete);
  std::__cxx11::string::string(local_6b0,"enable competition with marginal features",&local_6b2);
  std::__cxx11::string::_M_assign((string *)(local_680 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2a8,(typed_option<bool> *)local_680);
  VW::config::option_group_definition::add<bool>(&local_5e0,&local_2a8);
  VW::config::typed_option<bool>::~typed_option(&local_2a8);
  std::__cxx11::string::~string(local_6b0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_680);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::string((string *)&local_548,"update_before_learn",&local_6b1);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_680,&local_548,
             &(local_690._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->update_before_learn);
  std::__cxx11::string::string(local_6b0,"update marginal values before learning",&local_6b2);
  std::__cxx11::string::_M_assign((string *)(local_680 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_348,(typed_option<bool> *)local_680);
  VW::config::option_group_definition::add<bool>(&local_5e0,&local_348);
  VW::config::typed_option<bool>::~typed_option(&local_348);
  std::__cxx11::string::~string(local_6b0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_680);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::string((string *)&local_568,"unweighted_marginals",&local_6b1);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_680,&local_568,
             &(local_690._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->unweighted_marginals);
  std::__cxx11::string::string
            (local_6b0,"ignore importance weights when computing marginals",&local_6b2);
  std::__cxx11::string::_M_assign((string *)(local_680 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_3e8,(typed_option<bool> *)local_680);
  VW::config::option_group_definition::add<bool>(&local_5e0,&local_3e8);
  VW::config::typed_option<bool>::~typed_option(&local_3e8);
  std::__cxx11::string::~string(local_6b0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_680);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::string((string *)&local_588,"decay",&local_6b1);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_680,&local_588,
             &(local_690._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->decay);
  ptVar2 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_680,0.0);
  std::__cxx11::string::string(local_6b0,"decay multiplier per event (1e-3 for example)",&local_6b2)
  ;
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_488,ptVar2);
  VW::config::option_group_definition::add<float>(&local_5e0,&local_488);
  VW::config::typed_option<float>::~typed_option(&local_488);
  std::__cxx11::string::~string(local_6b0);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_680);
  std::__cxx11::string::~string((string *)&local_588);
  (**options->_vptr_options_i)(options,&local_5e0);
  std::__cxx11::string::string((string *)local_680,"marginal",(allocator *)local_6b0);
  iVar1 = (*options->_vptr_options_i[1])(options,local_680);
  std::__cxx11::string::~string((string *)local_680);
  if ((char)iVar1 == '\0') {
    plVar4 = (learner<MARGINAL::data,_example> *)0x0;
  }
  else {
    (local_690._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->all = all;
    for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
      lVar3 = std::__cxx11::string::find((char)&local_5a8,(ulong)(uint)(int)(char)lVar5);
      if (lVar3 != -1) {
        (local_690._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl)->id_features[lVar5] = true;
      }
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar4 = LEARNER::init_learner<MARGINAL::data,example,LEARNER::learner<char,example>>
                       (&local_690,base,MARGINAL::predict_or_learn<true>,
                        MARGINAL::predict_or_learn<false>);
    *(undefined8 *)(plVar4 + 0xb8) = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0xc0) = *(undefined8 *)(plVar4 + 0x20);
    *(code **)(plVar4 + 200) = MARGINAL::finish;
    *(code **)(plVar4 + 0x80) = MARGINAL::save_load;
    *(undefined8 *)(plVar4 + 0x70) = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0x78) = *(undefined8 *)(plVar4 + 0x20);
  }
  VW::config::option_group_definition::~option_group_definition(&local_5e0);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::~unique_ptr(&local_690);
  return (base_learner *)plVar4;
}

Assistant:

LEARNER::base_learner* marginal_setup(options_i& options, vw& all)
{
  free_ptr<MARGINAL::data> d = scoped_calloc_or_throw<MARGINAL::data>();
  std::string marginal;

  option_group_definition marginal_options("VW options");
  marginal_options.add(make_option("marginal", marginal).keep().help("substitute marginal label estimates for ids"));
  marginal_options.add(
      make_option("initial_denominator", d->initial_denominator).default_value(1.f).help("initial denominator"));
  marginal_options.add(
      make_option("initial_numerator", d->initial_numerator).default_value(0.5f).help("initial numerator"));
  marginal_options.add(make_option("compete", d->compete).help("enable competition with marginal features"));
  marginal_options.add(
      make_option("update_before_learn", d->update_before_learn).help("update marginal values before learning"));
  marginal_options.add(make_option("unweighted_marginals", d->unweighted_marginals)
                           .help("ignore importance weights when computing marginals"));
  marginal_options.add(
      make_option("decay", d->decay).default_value(0.f).help("decay multiplier per event (1e-3 for example)"));
  options.add_and_parse(marginal_options);

  if (!options.was_supplied("marginal"))
  {
    return nullptr;
  }

  d->all = &all;

  for (size_t u = 0; u < 256; u++)
    if (marginal.find((char)u) != string::npos)
      d->id_features[u] = true;

  LEARNER::learner<MARGINAL::data, example>& ret =
      init_learner(d, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  ret.set_finish(finish);
  ret.set_save_load(save_load);

  return make_base(ret);
}